

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_print_extensions
               (mbedtls_ssl_context *ssl,int level,char *file,int line,int hs_msg_type,
               uint32_t extensions_mask,char *extra)

{
  char *extra_msg0;
  uint *puVar1;
  uint i;
  long lVar2;
  
  puVar1 = extension_type_table;
  lVar2 = 0;
  do {
    extra_msg0 = "exists";
    if ((extensions_mask >> ((uint)lVar2 & 0x1f) & 1) == 0) {
      extra_msg0 = "does not exist";
    }
    mbedtls_ssl_print_extension(ssl,level,file,line,hs_msg_type,*puVar1,extra_msg0,extra);
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 0x1d);
  return;
}

Assistant:

void mbedtls_ssl_print_extensions(const mbedtls_ssl_context *ssl,
                                  int level, const char *file, int line,
                                  int hs_msg_type, uint32_t extensions_mask,
                                  const char *extra)
{

    for (unsigned i = 0;
         i < sizeof(extension_name_table) / sizeof(extension_name_table[0]);
         i++) {
        mbedtls_ssl_print_extension(
            ssl, level, file, line, hs_msg_type, extension_type_table[i],
            extensions_mask & (1 << i) ? "exists" : "does not exist", extra);
    }
}